

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast_socket.cpp
# Opt level: O2

bool libtorrent::is_local(address *a)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  address_v4 a4;
  anon_union_16_3_a3f0114d_for___in6_u local_20;
  
  if (a->type_ == ipv6) {
    boost::asio::ip::address::to_v6((address_v6 *)&local_20,a);
    bVar3 = boost::asio::ip::address_v6::is_loopback((address_v6 *)&local_20);
    bVar5 = true;
    if (!bVar3) {
      if ((local_20.__u6_addr8[0] != 0xfe) || (local_20.__u6_addr8[1] < 0xc0)) {
        if ((local_20.__u6_addr8[0] != 0xff) ||
           ((local_20.__u6_addr8[1] & 0xf) != 2 && (local_20.__u6_addr8[1] & 0xf) != 5)) {
          bVar5 = (local_20.__u6_addr32[0] & 0xfe) == 0xfc;
        }
      }
    }
  }
  else {
    boost::asio::ip::address::to_v4((address *)&local_20);
    uVar1 = (local_20.__u6_addr32[0] & 0xff00) << 8;
    uVar2 = local_20.__u6_addr32[0] << 0x18;
    uVar4 = uVar1 | uVar2;
    bVar5 = true;
    if ((((uVar1 & 0xfff00000 | uVar2) != 0xac100000 && uVar2 != 0xa000000) && (uVar4 != 0xa9fe0000)
        ) && (uVar4 != 0xc0a80000)) {
      bVar5 = uVar2 == 0x7f000000;
    }
  }
  return bVar5;
}

Assistant:

bool is_local(address const& a)
	{
		if (a.is_v6())
		{
			// NOTE: site local is deprecated but by
			// https://www.ietf.org/rfc/rfc3879.txt:
			// routers SHOULD be configured to prevent
			// routing of this prefix by default.

			address_v6 const a6 = a.to_v6();
			return a6.is_loopback()
				|| a6.is_link_local()
				|| a6.is_site_local()
				|| a6.is_multicast_link_local()
				|| a6.is_multicast_site_local()
				//  fc00::/7, unique local address
				|| (a6.to_bytes()[0] & 0xfe) == 0xfc;
		}
		address_v4 a4 = a.to_v4();
		unsigned long ip = a4.to_ulong();
		return ((ip & 0xff000000) == 0x0a000000 // 10.x.x.x
			|| (ip & 0xfff00000) == 0xac100000 // 172.16.x.x
			|| (ip & 0xffff0000) == 0xc0a80000 // 192.168.x.x
			|| (ip & 0xffff0000) == 0xa9fe0000 // 169.254.x.x
			|| (ip & 0xff000000) == 0x7f000000); // 127.x.x.x
	}